

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_short>::quantize
          (btAxisSweep3Internal<unsigned_short> *this,unsigned_short *out,btVector3 *point,int isMax
          )

{
  ushort uVar1;
  ushort uVar2;
  float fVar3;
  float fVar4;
  btVector3 bVar5;
  btVector3 local_28;
  
  uVar2 = (ushort)isMax;
  local_28 = operator-(point,&this->m_worldAabbMin);
  bVar5 = operator*(&local_28,&this->m_quantize);
  fVar3 = bVar5.m_floats[0];
  fVar4 = bVar5.m_floats[1];
  uVar1 = uVar2;
  if (0.0 < fVar3) {
    uVar1 = this->m_handleSentinel;
    if (fVar3 < (float)uVar1) {
      uVar1 = (ushort)(int)fVar3;
    }
    uVar1 = uVar1 & this->m_bpHandleMask | uVar2;
  }
  *out = uVar1;
  uVar1 = uVar2;
  if (0.0 < fVar4) {
    uVar1 = this->m_handleSentinel;
    if (fVar4 < (float)uVar1) {
      uVar1 = (ushort)(int)fVar4;
    }
    uVar1 = uVar1 & this->m_bpHandleMask | uVar2;
  }
  out[1] = uVar1;
  fVar3 = bVar5.m_floats[2];
  if (0.0 < fVar3) {
    uVar1 = this->m_handleSentinel;
    if (fVar3 < (float)uVar1) {
      uVar1 = (ushort)(int)fVar3;
    }
    uVar2 = uVar1 & this->m_bpHandleMask | uVar2;
  }
  out[2] = uVar2;
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::quantize(BP_FP_INT_TYPE* out, const btVector3& point, int isMax) const
{
#ifdef OLD_CLAMPING_METHOD
	///problem with this clamping method is that the floating point during quantization might still go outside the range [(0|isMax) .. (m_handleSentinel&m_bpHandleMask]|isMax]
	///see http://code.google.com/p/bullet/issues/detail?id=87
	btVector3 clampedPoint(point);
	clampedPoint.setMax(m_worldAabbMin);
	clampedPoint.setMin(m_worldAabbMax);
	btVector3 v = (clampedPoint - m_worldAabbMin) * m_quantize;
	out[0] = (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v.getX() & m_bpHandleMask) | isMax);
	out[1] = (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v.getY() & m_bpHandleMask) | isMax);
	out[2] = (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v.getZ() & m_bpHandleMask) | isMax);
#else
	btVector3 v = (point - m_worldAabbMin) * m_quantize;
	out[0]=(v[0]<=0)?(BP_FP_INT_TYPE)isMax:(v[0]>=m_handleSentinel)?(BP_FP_INT_TYPE)((m_handleSentinel&m_bpHandleMask)|isMax):(BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v[0]&m_bpHandleMask)|isMax);
	out[1]=(v[1]<=0)?(BP_FP_INT_TYPE)isMax:(v[1]>=m_handleSentinel)?(BP_FP_INT_TYPE)((m_handleSentinel&m_bpHandleMask)|isMax):(BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v[1]&m_bpHandleMask)|isMax);
	out[2]=(v[2]<=0)?(BP_FP_INT_TYPE)isMax:(v[2]>=m_handleSentinel)?(BP_FP_INT_TYPE)((m_handleSentinel&m_bpHandleMask)|isMax):(BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v[2]&m_bpHandleMask)|isMax);
#endif //OLD_CLAMPING_METHOD
}